

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

void __thiscall
Imath_3_2::Euler<float>::Euler(Euler<float> *this,Vec3<float> *v,Order p,InputLayout l)

{
  int in_ECX;
  Order in_EDX;
  Euler<float> *in_RSI;
  Vec3<float> *in_RDI;
  Euler<float> *unaff_retaddr;
  Vec3<float> *v_00;
  
  v_00 = in_RDI;
  Vec3<float>::Vec3(in_RDI);
  setOrder(in_RSI,in_EDX);
  if (in_ECX == 0) {
    setXYZVector(unaff_retaddr,v_00);
  }
  else {
    in_RDI->x = (in_RSI->super_Vec3<float>).x;
    in_RDI->y = (in_RSI->super_Vec3<float>).y;
    in_RDI->z = (in_RSI->super_Vec3<float>).z;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Euler<T>::Euler (
    const Vec3<T>&                 v,
    typename Euler<T>::Order       p,
    typename Euler<T>::InputLayout l) IMATH_NOEXCEPT
{
    setOrder (p);
    if (l == XYZLayout)
        setXYZVector (v);
    else
    {
        x = v.x;
        y = v.y;
        z = v.z;
    }
}